

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O3

uintptr_t ht_feature_cached_string_push(HT_Timeline *timeline,char *label)

{
  HT_Bag *bag;
  uint uVar1;
  HT_EventKlass *pHVar2;
  HT_TimestampNs HVar3;
  char *pcVar4;
  char cVar5;
  size_t sVar6;
  void *data;
  HT_Event local_50;
  void *local_38;
  char *local_30;
  
  bag = (HT_Bag *)timeline->features[1];
  if (bag == (HT_Bag *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/luisbg[P]hawktracer/lib/feature_cached_string.c"
                  ,0x1b,"uintptr_t ht_feature_cached_string_push(HT_Timeline *, const char *)");
  }
  cVar5 = *label;
  if (cVar5 == '\0') {
    data = (void *)0x1505;
  }
  else {
    pcVar4 = label + 1;
    uVar1 = 0x1505;
    do {
      uVar1 = uVar1 * 0x21 + (int)cVar5;
      cVar5 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar5 != '\0');
    data = (void *)(ulong)uVar1;
  }
  if (bag->size != 0) {
    sVar6 = 0;
    do {
      if (data == bag->data[sVar6]) {
        return (uintptr_t)data;
      }
      sVar6 = sVar6 + 1;
    } while (bag->size != sVar6);
  }
  ht_bag_add(bag,data);
  pHVar2 = ht_HT_StringMappingEvent_get_event_klass_instance();
  HVar3 = ht_monotonic_clock_get_timestamp();
  local_50.id = ht_event_id_provider_next(timeline->id_provider);
  local_50.klass = pHVar2;
  local_50.timestamp = HVar3;
  local_38 = data;
  local_30 = label;
  ht_timeline_push_event(timeline,&local_50);
  return (uintptr_t)data;
}

Assistant:

uintptr_t
ht_feature_cached_string_push(HT_Timeline* timeline, const char* label)
{
    HT_FeatureCachedString* f = (HT_FeatureCachedString*)timeline->features[HT_FEATURE_CACHED_STRING];
    assert(f);
    size_t i;
    uintptr_t id = djb2_hash(label);

    for (i = 0; i < f->cached_data.size; i++)
    {
        if ((uintptr_t)f->cached_data.data[i] == id)
        {
            return id;
        }
    }

    ht_bag_add(&f->cached_data, (void*)id);
    HT_TIMELINE_PUSH_EVENT(timeline, HT_StringMappingEvent, id, label);

    return id;
}